

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall
rlottie::internal::renderer::CompLayer::renderHelper
          (CompLayer *this,VPainter *painter,VRle *inheritMask,VRle *matteRle,SurfaceCache *cache)

{
  int iVar1;
  LayerMask *clipRect;
  model *pmVar2;
  Clipper *mask_00;
  pointer ppLVar3;
  Layer *pLVar4;
  VSize VVar5;
  VSize VVar6;
  pointer ppLVar7;
  CompLayer *this_00;
  CompLayer *layer;
  VRle mask;
  type tmp;
  type tmp_1;
  VSize local_60;
  SurfaceCache *local_58;
  VSize local_50;
  VRect local_48;
  VSize local_38;
  
  local_58 = cache;
  vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)&local_60);
  clipRect = (this->super_Layer).mLayerMask._M_t.
             super___uniq_ptr_impl<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::renderer::LayerMask_*,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             .super__Head_base<0UL,_rlottie::internal::renderer::LayerMask_*,_false>._M_head_impl;
  if (clipRect == (LayerMask *)0x0) {
    vcow_ptr<VRle::Data>::operator=((vcow_ptr<VRle::Data> *)&local_60,&inheritMask->d);
  }
  else {
    local_48 = VPainter::clipBoundingRect(painter);
    LayerMask::maskRle((LayerMask *)&local_38,(VRect *)clipRect);
    VVar5 = local_38;
    local_50 = local_60;
    local_38.mw = 0;
    local_38.mh = 0;
    local_60 = VVar5;
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_50);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_38);
    pmVar2 = (inheritMask->d).mModel;
    if ((pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      VRle::operator&((VRle *)&local_50,(VRle *)&local_60);
      VVar6 = local_50;
      VVar5 = local_60;
      local_50.mw = 0;
      local_50.mh = 0;
      local_60 = VVar6;
      VVar6 = local_60;
      local_60.mw = VVar5.mw;
      local_60.mh = VVar5.mh;
      local_48.x1 = local_60.mw;
      local_48.y1 = local_60.mh;
      local_60 = VVar6;
      vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_48);
      vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_50);
    }
    if (*(long *)((long)local_60 + 8) == *(long *)((long)local_60 + 0x10)) goto LAB_00128a47;
  }
  mask_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if (mask_00 != (Clipper *)0x0) {
    Clipper::rle((Clipper *)&local_50,(VRle *)mask_00);
    VVar6 = local_50;
    VVar5 = local_60;
    local_50.mw = 0;
    local_50.mh = 0;
    local_60 = VVar6;
    VVar6 = local_60;
    local_60.mw = VVar5.mw;
    local_60.mh = VVar5.mh;
    local_48.x1 = local_60.mw;
    local_48.y1 = local_60.mh;
    local_60 = VVar6;
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_48);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_50);
    if (*(long *)((long)local_60 + 8) == *(long *)((long)local_60 + 0x10)) goto LAB_00128a47;
  }
  ppLVar7 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar7 != ppLVar3) {
    layer = (CompLayer *)0x0;
    do {
      this_00 = (CompLayer *)*ppLVar7;
      pLVar4 = (this_00->super_Layer).mLayerData;
      if (pLVar4->mMatteType == None) {
        iVar1 = (this_00->super_Layer).mFrameNo;
        if ((pLVar4->mInFrame <= iVar1) && (iVar1 <= pLVar4->mOutFrame)) {
          if (layer == (CompLayer *)0x0) {
            (*(this_00->super_Layer)._vptr_Layer[4])(this_00,painter,&local_60,matteRle,local_58);
          }
          else {
            iVar1 = (layer->super_Layer).mFrameNo;
            pLVar4 = (layer->super_Layer).mLayerData;
            if ((pLVar4->mInFrame <= iVar1) && (iVar1 <= pLVar4->mOutFrame)) {
              renderMatteLayer(this_00,painter,(VRle *)&local_60,matteRle,&layer->super_Layer,
                               (Layer *)this_00,local_58);
            }
          }
        }
        this_00 = (CompLayer *)0x0;
      }
      ppLVar7 = ppLVar7 + 1;
      layer = this_00;
    } while (ppLVar7 != ppLVar3);
  }
LAB_00128a47:
  vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_60);
  return;
}

Assistant:

void renderer::CompLayer::renderHelper(VPainter *    painter,
                                       const VRle &  inheritMask,
                                       const VRle &  matteRle,
                                       SurfaceCache &cache)
{
    VRle mask;
    if (mLayerMask) {
        mask = mLayerMask->maskRle(painter->clipBoundingRect());
        if (!inheritMask.empty()) mask = mask & inheritMask;
        // if resulting mask is empty then return.
        if (mask.empty()) return;
    } else {
        mask = inheritMask;
    }

    if (mClipper) {
        mask = mClipper->rle(mask);
        if (mask.empty()) return;
    }

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible())
                        renderMatteLayer(painter, mask, matteRle, matte, layer,
                                         cache);
                } else {
                    layer->render(painter, mask, matteRle, cache);
                }
            }
            matte = nullptr;
        }
    }
}